

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O2

set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> * __thiscall
dg::StrongControlClosure::theta
          (set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
           *__return_storage_ptr__,StrongControlClosure *this,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *X,CDNode *n)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  CDNode *local_28;
  anon_class_8_1_6972301e local_20;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = n;
  sVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::count
                    (X,&local_28);
  if (sVar2 == 0) {
    local_20.retval = __return_storage_ptr__;
    foreachFirstReachable<std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,dg::StrongControlClosure::theta(std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>const&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
              (this,X,local_28,&local_20);
  }
  else {
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>
              ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CDNode *> theta(const std::set<CDNode *> &X, CDNode *n) {
        std::set<CDNode *> retval;
        if (X.count(n) > 0) {
            retval.insert(n);
            return retval;
        }
        foreachFirstReachable(X, n, [&](CDNode *cur) { retval.insert(cur); });
        return retval;
    }